

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.cpp
# Opt level: O1

bool __thiscall ParsedJson::allocateCapacity(ParsedJson *this,size_t len,size_t maxdepth)

{
  ulong uVar1;
  uint32_t *puVar2;
  uint8_t *puVar3;
  uint64_t *puVar4;
  uint32_t *puVar5;
  void **ppvVar6;
  ulong uVar7;
  
  if (len == 0 || maxdepth == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"capacities must be non-zero ",0x1c);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x78);
    std::ostream::put(-0x78);
    std::ostream::flush();
  }
  else {
    if ((len <= this->bytecapacity) && (this->depthcapacity < maxdepth)) {
      return true;
    }
    deallocate(this);
    this->isvalid = false;
    this->bytecapacity = 0;
    this->n_structural_indexes = 0;
    uVar1 = len + 0x3f;
    puVar2 = (uint32_t *)
             operator_new__((ulong)((uint)uVar1 & 0xffffffc0) * 4 + 0x24,(nothrow_t *)&std::nothrow)
    ;
    this->structural_indexes = puVar2;
    uVar7 = len + 0x5f & 0xffffffffffffffc0;
    puVar3 = (uint8_t *)operator_new__(uVar7,(nothrow_t *)&std::nothrow);
    this->string_buf = puVar3;
    puVar4 = (uint64_t *)
             operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | (uVar1 & 0xffffffffffffffc0) * 8,
                            (nothrow_t *)&std::nothrow);
    this->tape = puVar4;
    puVar5 = (uint32_t *)
             operator_new__(-(ulong)(maxdepth >> 0x3e != 0) | maxdepth * 4,
                            (nothrow_t *)&std::nothrow);
    this->containing_scope_offset = puVar5;
    ppvVar6 = (void **)operator_new__(-(ulong)(maxdepth >> 0x3d != 0) | maxdepth * 8,
                                      (nothrow_t *)&std::nothrow);
    this->ret_address = ppvVar6;
    if ((((puVar2 != (uint32_t *)0x0) && (puVar3 != (uint8_t *)0x0)) && (puVar4 != (uint64_t *)0x0))
       && ((puVar5 != (uint32_t *)0x0 && (ppvVar6 != (void **)0x0)))) {
      this->bytecapacity = len;
      this->depthcapacity = maxdepth;
      this->tapecapacity = uVar1 & 0xffffffffffffffc0;
      this->stringcapacity = uVar7;
      return true;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Could not allocate memory",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x78);
    std::ostream::put(-0x78);
    std::ostream::flush();
    if (this->ret_address != (void **)0x0) {
      operator_delete__(this->ret_address);
    }
    if (this->containing_scope_offset != (uint32_t *)0x0) {
      operator_delete__(this->containing_scope_offset);
    }
    if (this->tape != (uint64_t *)0x0) {
      operator_delete__(this->tape);
    }
    if (this->string_buf != (uint8_t *)0x0) {
      operator_delete__(this->string_buf);
    }
    if (this->structural_indexes != (uint32_t *)0x0) {
      operator_delete__(this->structural_indexes);
    }
  }
  return false;
}

Assistant:

WARN_UNUSED
bool ParsedJson::allocateCapacity(size_t len, size_t maxdepth) {
    if ((maxdepth == 0) || (len == 0)) {
      std::cerr << "capacities must be non-zero " << std::endl;
      return false;
    }
    if (len > 0) {
      if ((len <= bytecapacity) && (depthcapacity < maxdepth)) {
        return true;
}
      deallocate();
    }
    isvalid = false;
    bytecapacity = 0; // will only set it to len after allocations are a success
    n_structural_indexes = 0;
    uint32_t max_structures = ROUNDUP_N(len, 64) + 2 + 7;
    structural_indexes = new (std::nothrow) uint32_t[max_structures];
    size_t localtapecapacity = ROUNDUP_N(len, 64);
    size_t localstringcapacity = ROUNDUP_N(len + 32, 64);
    string_buf = new (std::nothrow) uint8_t[localstringcapacity];
    tape = new (std::nothrow) uint64_t[localtapecapacity];
    containing_scope_offset = new (std::nothrow) uint32_t[maxdepth];
#ifdef SIMDJSON_USE_COMPUTED_GOTO
    ret_address = new (std::nothrow) void *[maxdepth];
#else
    ret_address = new (std::nothrow) char[maxdepth];
#endif
    if ((string_buf == nullptr) || (tape == nullptr) ||
        (containing_scope_offset == nullptr) || (ret_address == nullptr) || (structural_indexes == nullptr)) {
      std::cerr << "Could not allocate memory" << std::endl;
      delete[] ret_address;
      delete[] containing_scope_offset;
      delete[] tape;
      delete[] string_buf;
      delete[] structural_indexes;

      return false;
    }

    bytecapacity = len;
    depthcapacity = maxdepth;
    tapecapacity = localtapecapacity;
    stringcapacity = localstringcapacity;
    return true;
}